

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

GlxDrawable * tcu::x11::glx::createDrawable(GlxVisual *visual,RenderConfig *config)

{
  Visual *pVVar1;
  GlxWindow *this;
  NotSupportedError *this_00;
  SurfaceType local_1c;
  SurfaceType surfaceType;
  RenderConfig *config_local;
  GlxVisual *visual_local;
  
  local_1c = config->surfaceType;
  if (local_1c == SURFACETYPE_DONT_CARE) {
    pVVar1 = GlxVisual::getXVisual(visual);
    if (pVVar1 == (Visual *)0x0) {
      local_1c = SURFACETYPE_OFFSCREEN_NATIVE;
    }
    else {
      local_1c = SURFACETYPE_WINDOW;
    }
  }
  if ((local_1c != SURFACETYPE_DONT_CARE) && (local_1c != SURFACETYPE_WINDOW)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_00,"Unsupported surface type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x28f);
    __cxa_throw(this_00,&NotSupportedError::typeinfo,NotSupportedError::~NotSupportedError);
  }
  this = (GlxWindow *)operator_new(0x40);
  GlxWindow::GlxWindow(this,visual,config);
  return &this->super_GlxDrawable;
}

Assistant:

GlxDrawable* createDrawable (GlxVisual& visual, const RenderConfig& config)
{
	RenderConfig::SurfaceType surfaceType = config.surfaceType;

	if (surfaceType == RenderConfig::SURFACETYPE_DONT_CARE)
	{
		if (visual.getXVisual() == DE_NULL)
			// No visual, cannot create X window
			surfaceType = RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE;
		else
			surfaceType = RenderConfig::SURFACETYPE_WINDOW;
	}

	switch (surfaceType)
	{
		case RenderConfig::SURFACETYPE_DONT_CARE:
			DE_FATAL("Impossible case");

		case RenderConfig::SURFACETYPE_WINDOW:
			return new GlxWindow(visual, config);
			break;

		case RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE:
			// \todo [2013-11-28 lauri] Pixmaps

		case RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC:
			// \todo [2013-11-28 lauri] Pbuffers

		default:
			TCU_THROW(NotSupportedError, "Unsupported surface type");
	}

	return DE_NULL;
}